

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O2

int del_epoll(int fd)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  epoll_event ev;
  
  iVar1 = epoll_ctl(cfg.epoll_fd,2,fd,(epoll_event *)&ev);
  __stream = _stderr;
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"epoll_ctl: %s\n",pcVar3);
  }
  return iVar1;
}

Assistant:

int del_epoll(int fd) {
  int rc;
  struct epoll_event ev;
  rc = epoll_ctl(cfg.epoll_fd, EPOLL_CTL_DEL, fd, &ev);
  if (rc == -1) {
    fprintf(stderr,"epoll_ctl: %s\n", strerror(errno));
  }
  return rc;
}